

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intermission_parse.cpp
# Opt level: O0

bool __thiscall
FIntermissionActionScroller::ParseKey(FIntermissionActionScroller *this,FScanner *sc)

{
  bool bVar1;
  int iVar2;
  int v;
  ScrollType ST [5];
  FScanner *sc_local;
  FIntermissionActionScroller *this_local;
  
  memcpy(&stack0xffffffffffffff88,&DAT_009ec960,0x50);
  bVar1 = FScanner::Compare(sc,"ScrollDirection");
  if (bVar1) {
    FScanner::MustGetToken(sc,0x3d);
    FScanner::MustGetToken(sc,0x101);
    iVar2 = FScanner::MatchString(sc,(char **)&stack0xffffffffffffff88,0x10);
    if (iVar2 != -1) {
      this->mScrollDir = *(int *)&ST[iVar2].Name;
    }
    this_local._7_1_ = true;
  }
  else {
    bVar1 = FScanner::Compare(sc,"InitialDelay");
    if (bVar1) {
      FScanner::MustGetToken(sc,0x3d);
      bVar1 = FScanner::CheckToken(sc,0x2d);
      if (bVar1) {
        FScanner::MustGetToken(sc,0x104);
        this->mScrollDelay = sc->Number;
      }
      else {
        FScanner::MustGetFloat(sc);
        this->mScrollDelay = (int)(sc->Float * 35.0);
      }
      this_local._7_1_ = true;
    }
    else {
      bVar1 = FScanner::Compare(sc,"ScrollTime");
      if (bVar1) {
        FScanner::MustGetToken(sc,0x3d);
        bVar1 = FScanner::CheckToken(sc,0x2d);
        if (bVar1) {
          FScanner::MustGetToken(sc,0x104);
          this->mScrollTime = sc->Number;
        }
        else {
          FScanner::MustGetFloat(sc);
          this->mScrollTime = (int)(sc->Float * 35.0);
        }
        this_local._7_1_ = true;
      }
      else {
        bVar1 = FScanner::Compare(sc,"Background2");
        if (bVar1) {
          FScanner::MustGetToken(sc,0x3d);
          FScanner::MustGetToken(sc,0x102);
          FString::operator=(&this->mSecondPic,sc->String);
          this_local._7_1_ = true;
        }
        else {
          this_local._7_1_ = FIntermissionAction::ParseKey(&this->super_FIntermissionAction,sc);
        }
      }
    }
  }
  return this_local._7_1_;
}

Assistant:

bool FIntermissionActionScroller::ParseKey(FScanner &sc)
{
	struct ScrollType
	{
		const char *Name;
		EScrollDir Type;
	}
	const ST[] = {
		{ "Left", SCROLL_Left },
		{ "Right", SCROLL_Right },
		{ "Up", SCROLL_Up },
		{ "Down", SCROLL_Down },
		{ NULL, SCROLL_Left }
	};

	if (sc.Compare("ScrollDirection"))
	{
		sc.MustGetToken('=');
		sc.MustGetToken(TK_Identifier);
		int v = sc.MatchString(&ST[0].Name, sizeof(ST[0]));
		if (v != -1) mScrollDir = ST[v].Type;
		return true;
	}
	else if (sc.Compare("InitialDelay"))
	{
		sc.MustGetToken('=');
		if (!sc.CheckToken('-'))
		{
			sc.MustGetFloat();
			mScrollDelay = int(sc.Float*TICRATE);
		}
		else
		{
			sc.MustGetToken(TK_IntConst);
			mScrollDelay = sc.Number;
		}
		return true;
	}
	else if (sc.Compare("ScrollTime"))
	{
		sc.MustGetToken('=');
		if (!sc.CheckToken('-'))
		{
			sc.MustGetFloat();
			mScrollTime = int(sc.Float*TICRATE);
		}
		else
		{
			sc.MustGetToken(TK_IntConst);
			mScrollTime = sc.Number;
		}
		return true;
	}
	else if (sc.Compare("Background2"))
	{
		sc.MustGetToken('=');
		sc.MustGetToken(TK_StringConst);
		mSecondPic = sc.String;
		return true;
	}
	else return Super::ParseKey(sc);
}